

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_CreateVerilogNtk(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  Vec_Int_t *p_00;
  Cba_Man_t *p_01;
  char **ppcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Cba_ObjType_t CVar6;
  int iVar7;
  int iVar8;
  Cba_ObjType_t CVar9;
  Vec_Ptr_t *pVVar10;
  char *pcVar11;
  void *pvVar12;
  Vec_Int_t *pVVar13;
  Cba_Ntk_t *pCVar14;
  undefined4 extraout_var;
  Prs_Ntk_t *pNtk_00;
  Prs_Ntk_t *pNtk_01;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  Prs_Ntk_t *pPVar19;
  int nInputs;
  Prs_Ntk_t *local_a8;
  Vec_Int_t *local_a0;
  Vec_Int_t *local_98;
  int local_8c;
  Vec_Ptr_t *local_88;
  Vec_Ptr_t *local_80;
  char **pOutNames;
  int iBitRst;
  int iBitSet;
  int IndexRst;
  int IndexSet;
  Vec_Int_t *local_60;
  Cba_Ntk_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  local_60 = Vec_IntStart((pNtk->vObjs).nSize);
  Cba_NtkCleanMap(p);
  local_a8 = pNtk;
  for (iVar17 = 0; iVar17 < (p->vInputs).nSize; iVar17 = iVar17 + 1) {
    iVar2 = Vec_IntEntry(&p->vInputs,iVar17);
    iVar3 = Cba_ObjName(p,iVar2);
    iVar2 = Cba_ObjFon0(p,iVar2);
    pNtk = local_a8;
    Cba_NtkSetMap(p,iVar3,iVar2);
  }
  pVVar13 = &pNtk->vWires;
  p_00 = &pNtk->vWiresR;
  for (iVar17 = 0; iVar17 < (pNtk->vWires).nSize; iVar17 = iVar17 + 1) {
    iVar2 = Vec_IntEntry(pVVar13,iVar17);
    iVar3 = Vec_IntEntry(p_00,iVar17);
    pNtk = local_a8;
    Cba_NtkSetMap(p,iVar2,-iVar3);
  }
  local_48 = &pNtk->vOutputs;
  local_50 = &pNtk->vOutputsR;
  for (iVar17 = 0; iVar17 < (pNtk->vOutputs).nSize; iVar17 = iVar17 + 1) {
    iVar2 = Vec_IntEntry(local_48,iVar17);
    iVar3 = Vec_IntEntry(local_50,iVar17);
    Cba_NtkSetMap(p,iVar2,-iVar3);
  }
  pVVar10 = Prs_CreateDetectRams(pNtk);
  if (pVVar10 != (Vec_Ptr_t *)0x0) {
    iVar17 = 0;
    local_88 = pVVar10;
    local_58 = p;
    while (p = local_58, pVVar10 = local_88, iVar17 < local_88->nSize) {
      local_8c = iVar17;
      pVVar10 = (Vec_Ptr_t *)Vec_PtrEntry(local_88,iVar17);
      pcVar11 = (char *)Vec_PtrEntry(pVVar10,0);
      pvVar12 = Vec_PtrEntry(pVVar10,1);
      iVar17 = Cba_NtkNewStrId(p,"%s_box",pcVar11);
      iVar2 = Cba_ObjAlloc(p,CBA_BOX_RAMBOX,pVVar10->nSize + -2,1);
      Cba_ObjSetName(p,iVar2,iVar17);
      local_98 = (Vec_Int_t *)CONCAT44(local_98._4_4_,iVar2);
      iVar17 = Cba_ObjFon0(p,iVar2);
      local_a0 = (Vec_Int_t *)pcVar11;
      iVar2 = Cba_NtkNewStrId(p,pcVar11);
      Cba_FonSetName(p,iVar17,iVar2);
      Prs_CreateRange(p,iVar17,iVar2);
      iVar2 = Cba_FonLeft(p,iVar17);
      if ((int)pvVar12 <= iVar2) {
        __assert_fail("Cba_FonLeft(p, iFon) <= MemSize-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x737,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      iVar17 = Cba_FonRight(p,iVar17);
      if (iVar17 != 0) {
        __assert_fail("Cba_FonRight(p, iFon) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x738,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      local_80 = pVVar10;
      for (iVar17 = 2; iVar17 < local_80->nSize; iVar17 = iVar17 + 2) {
        pVVar13 = (Vec_Int_t *)Vec_PtrEntry(local_80,iVar17);
        iVar2 = Cba_ObjAlloc(local_58,CBA_BOX_RAMWC,4,1);
        pPVar19 = local_a8;
        if (pVVar13->nSize < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
        }
        uVar4 = pVVar13->nSize - 1;
        pVVar13->nSize = uVar4;
        iVar3 = pVVar13->pArray[uVar4];
        Vec_IntWriteEntry(local_60,iVar3,iVar2);
        iVar5 = Prs_BoxName(pPVar19,iVar3);
        pCVar14 = local_58;
        if (iVar5 != 0) {
          iVar3 = Prs_BoxName(pPVar19,iVar3);
          Cba_ObjSetName(pCVar14,iVar2,iVar3);
        }
        iVar2 = Cba_ObjFon0(pCVar14,iVar2);
        iVar3 = Cba_NtkHashRange(pCVar14,(int)pvVar12 + -1,0);
        Cba_FonSetRange(pCVar14,iVar2,iVar3);
        iVar3 = Cba_NtkNewStrId(pCVar14,"%s_wp%d",local_a0,(ulong)(iVar17 - 2U));
        Cba_FonSetName(pCVar14,iVar2,iVar3);
        Cba_NtkSetMap(pCVar14,iVar3,iVar2);
        Cba_ObjSetFinFon(pCVar14,(int)local_98,iVar17 - 2U,iVar2);
        Vec_IntFree(pVVar13);
      }
      Vec_PtrFree(local_80);
      iVar17 = local_8c + 1;
    }
    free(local_88->pArray);
    free(pVVar10);
  }
  (p->vArray0).nSize = 0;
  local_98 = &p->vArray0;
  local_a0 = &p->vObjFunc;
  for (iVar17 = 0; pPVar19 = local_a8, iVar17 < (local_a8->vObjs).nSize; iVar17 = iVar17 + 1) {
    Prs_BoxSignals(local_a8,iVar17);
    iVar2 = Prs_BoxIsNode(pPVar19,iVar17);
    if (iVar2 == 0) {
      pOutNames = (char **)0x0;
      iVar2 = Prs_BoxNtk(pPVar19,iVar17);
      pcVar11 = Prs_NtkStr(pPVar19,iVar2);
      CVar6 = Prs_ManFindType(pcVar11,&nInputs,1,&pOutNames);
      if (CVar6 == CBA_BOX_DFFCPL) {
LAB_003589af:
        uVar4 = 2;
LAB_00358a1d:
        pCVar14 = (Cba_Ntk_t *)0x0;
LAB_00358abb:
        iVar2 = Cba_ObjAlloc(p,CVar6,nInputs,uVar4);
        if (pCVar14 == (Cba_Ntk_t *)0x0) {
          Cba_NtkCleanMap2(p);
          ppcVar1 = pOutNames;
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          uVar15 = 0;
          while (uVar4 != uVar15) {
            iVar3 = Cba_NtkStrId(p,ppcVar1[uVar15]);
            uVar15 = uVar15 + 1;
            Cba_NtkSetMap2(p,iVar3,(int)uVar15);
          }
        }
        else {
          iVar3 = pCVar14->Id;
          iVar5 = Cba_ObjFunc(p,iVar2);
          if (iVar5 != 0) {
            __assert_fail("Cba_ObjFunc(p, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xf8,"void Cba_ObjSetFunc(Cba_Ntk_t *, int, int)");
          }
          Vec_IntSetEntry(local_a0,iVar2,iVar3);
          Cba_NtkCleanMap2(p);
          iVar3 = 0;
          while (iVar3 < (pCVar14->vOutputs).nSize) {
            iVar5 = Vec_IntEntry(&pCVar14->vOutputs,iVar3);
            iVar5 = Cba_ObjName(pCVar14,iVar5);
            iVar3 = iVar3 + 1;
            Cba_NtkSetMap2(p,iVar5,iVar3);
          }
        }
        for (iVar3 = 1; pPVar19 = local_a8, iVar3 < Prs_BoxSignals::V.nSize; iVar3 = iVar3 + 2) {
          iVar5 = Vec_IntEntry(&Prs_BoxSignals::V,iVar3 + -1);
          iVar7 = Vec_IntEntry(&Prs_BoxSignals::V,iVar3);
          iVar8 = Cba_NtkGetMap2(p,iVar5);
          if (iVar8 != 0) {
            iVar5 = Cba_NtkGetMap2(p,iVar5);
            if (iVar2 < 1) {
              __assert_fail("i>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xea,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
            }
            iVar8 = Cba_ObjFon0(p,iVar2);
            Prs_CreateSignalOut(p,iVar5 + iVar8 + -1,local_a8,iVar7);
          }
        }
        goto LAB_00358be6;
      }
      if (CVar6 == CBA_BOX_NMUX) {
        iVar2 = strncmp(pcVar11,"wide_mux_",9);
        if (iVar2 == 0) {
          pcVar11 = pcVar11 + 9;
        }
        else {
          iVar2 = strncmp(pcVar11,"Mux_",4);
          if (iVar2 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x777,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          pcVar11 = pcVar11 + 4;
        }
        iVar2 = atoi(pcVar11);
        uVar4 = 1;
        nInputs = (1 << ((byte)iVar2 & 0x1f)) + 1;
        pCVar14 = (Cba_Ntk_t *)0x0;
        CVar6 = CBA_BOX_NMUX;
        goto LAB_00358abb;
      }
      if (CVar6 == CBA_BOX_SEL) {
        iVar2 = strncmp(pcVar11,"wide_select_",0xc);
        if (iVar2 == 0) {
          pcVar11 = pcVar11 + 0xc;
        }
        else {
          iVar2 = strncmp(pcVar11,"Select_",7);
          if (iVar2 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x77f,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          pcVar11 = pcVar11 + 7;
        }
        iVar2 = atoi(pcVar11);
        nInputs = iVar2 + 1;
        uVar4 = 1;
        pCVar14 = (Cba_Ntk_t *)0x0;
        CVar6 = CBA_BOX_SEL;
        goto LAB_00358abb;
      }
      if (CVar6 == CBA_BOX_ADD) goto LAB_003589af;
      if (CVar6 != CBA_BOX_RAMWC) {
        if (CVar6 == CBA_OBJ_BOX) {
          p_01 = p->pDesign;
          iVar2 = Abc_NamStrFind(p_01->pMods,pcVar11);
          pCVar14 = Cba_ManNtk(p_01,iVar2);
          if (pCVar14 == (Cba_Ntk_t *)0x0) {
            printf("Fatal error: Cannot find module \"%s\".\n",pcVar11);
            goto LAB_00358c1c;
          }
          nInputs = (pCVar14->vInputs).nSize;
          uVar4 = (pCVar14->vOutputs).nSize;
          CVar6 = CBA_OBJ_BOX;
        }
        else {
          if (((CVar6 != CBA_BOX_DFFRS) && (CVar6 != CBA_BOX_LATCHRS)) ||
             (iVar2 = strncmp(pcVar11,"wide_",5), iVar2 != 0)) {
            uVar4 = 1;
            goto LAB_00358a1d;
          }
          iVar2 = Prs_CreateFlopSetReset
                            (p,local_a8,&Prs_BoxSignals::V,(int *)0x0,(int *)0x0,(int *)0x0,
                             (int *)0x0);
          uVar4 = 1;
          pCVar14 = (Cba_Ntk_t *)0x0;
          if (iVar2 == 0) {
            nInputs = atoi(pcVar11 + (ulong)(CVar6 != CBA_BOX_DFFRS) * 2 + 0xb);
            uVar4 = 1;
            pCVar14 = (Cba_Ntk_t *)0x0;
            CVar6 = CBA_BOX_CONCAT;
          }
        }
        goto LAB_00358abb;
      }
    }
    else {
      CVar6 = Prs_BoxNtk(pPVar19,iVar17);
      iVar2 = Prs_BoxSize(pPVar19,iVar17);
      iVar2 = Cba_ObjAlloc(p,CVar6,iVar2 / 2 + -1,(CVar6 == CBA_BOX_ADD) + 1);
      iVar3 = Cba_ObjFon0(p,iVar2);
      iVar5 = Vec_IntEntry(&Prs_BoxSignals::V,1);
      Prs_CreateSignalOut(p,iVar3,pPVar19,iVar5);
LAB_00358be6:
      Vec_IntWriteEntry(local_60,iVar17,iVar2);
      iVar3 = Prs_BoxName(pPVar19,iVar17);
      if (iVar3 != 0) {
        iVar3 = Prs_BoxName(local_a8,iVar17);
        Cba_ObjSetName(p,iVar2,iVar3);
      }
    }
LAB_00358c1c:
  }
  iVar17 = (p->vArray0).nSize;
  if (iVar17 != 0) {
    if (iVar17 % 3 != 0) {
      __assert_fail("Vec_IntSize(p) % nMulti == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x572,"void Vec_IntSortMulti(Vec_Int_t *, int, int)");
    }
    qsort((p->vArray0).pArray,(long)(iVar17 / 3),0xc,Vec_IntSortCompare1);
    pVVar13 = local_98;
    iVar17 = 0;
    iVar3 = 0;
    iVar2 = -1;
    while( true ) {
      if ((p->vArray0).nSize <= iVar3 + 2) break;
      local_a0 = (Vec_Int_t *)(long)iVar17;
      iVar5 = Vec_IntEntry(pVVar13,iVar3);
      Vec_IntEntry(pVVar13,iVar3 + 1);
      Vec_IntEntry(pVVar13,iVar3 + 2);
      if (iVar2 != iVar5 && iVar2 != -1) {
        Prs_CreateOutConcat(p,(p->vArray0).pArray + (long)local_a0,(iVar3 - (int)local_a0) / 3);
        iVar17 = iVar3;
      }
      iVar3 = iVar3 + 3;
      iVar2 = iVar5;
    }
    Prs_CreateOutConcat(p,(p->vArray0).pArray + iVar17,(iVar3 - iVar17) / 3);
  }
  local_38 = &p->vFinFon;
  local_40 = &p->vObjFin0;
  iVar17 = 0;
  pPVar19 = local_a8;
  do {
    if ((pPVar19->vObjs).nSize <= iVar17) {
      Vec_IntFree(local_60);
      iVar17 = 0;
      do {
        if ((pPVar19->vOutputs).nSize <= iVar17) {
          return 0;
        }
        iVar2 = Vec_IntEntry(local_48,iVar17);
        iVar3 = Vec_IntEntry(local_50,iVar17);
        iVar5 = Vec_IntEntry(&p->vOutputs,iVar17);
        iVar7 = Cba_ObjName(p,iVar5);
        if (iVar2 != iVar7) {
          __assert_fail("NameId == Cba_ObjName(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x83e,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        iVar2 = Prs_CreateVerilogFindFon(p,iVar2);
        if ((iVar2 != 0) && (Cba_ObjSetFinFon(p,iVar5,0,iVar2), iVar3 != 0)) {
          iVar5 = Abc_Lit2Var(iVar3);
          iVar5 = Cba_NtkRangeLeft(p,iVar5);
          iVar7 = Cba_FonLeft(p,iVar2);
          if (iVar5 != iVar7) {
            __assert_fail("Cba_NtkRangeLeft(p, Abc_Lit2Var(RangeId)) == Cba_FonLeft(p, iFon)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x845,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          iVar3 = Abc_Lit2Var(iVar3);
          iVar3 = Cba_NtkRangeRight(p,iVar3);
          iVar2 = Cba_FonRight(p,iVar2);
          if (iVar3 != iVar2) {
            __assert_fail("Cba_NtkRangeRight(p, Abc_Lit2Var(RangeId)) == Cba_FonRight(p, iFon)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x846,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
        }
        iVar17 = iVar17 + 1;
        pPVar19 = local_a8;
      } while( true );
    }
    Prs_BoxSignals(pPVar19,iVar17);
    iVar2 = Vec_IntEntry(local_60,iVar17);
    iVar3 = Prs_BoxIsNode(pPVar19,iVar17);
    if (iVar3 == 0) {
      nInputs = -1;
      pOutNames = (char **)0x0;
      iVar3 = Prs_BoxNtk(pPVar19,iVar17);
      pcVar11 = Prs_NtkStr(pPVar19,iVar3);
      CVar6 = Prs_ManFindType(pcVar11,&nInputs,0,&pOutNames);
      local_80 = (Vec_Ptr_t *)CONCAT44(local_80._4_4_,CVar6);
      local_8c = iVar17;
      if (((CVar6 != CBA_BOX_DFFRS) && (CVar6 != CBA_BOX_LATCHRS)) ||
         (iVar3 = strncmp(pcVar11,"wide_",5), iVar3 != 0)) {
LAB_00358ef8:
        CVar9 = Cba_ObjType(p,iVar2);
        if (CVar6 != CVar9) {
          __assert_fail("Type == Cba_ObjType(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x7f5,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        Cba_NtkCleanMap2(p);
        ppcVar1 = pOutNames;
        if (CVar6 == CBA_OBJ_BOX) {
          pCVar14 = Cba_ObjNtk(p,iVar2);
          iVar17 = (pCVar14->vInputs).nSize;
          iVar3 = Cba_ObjFinNum(p,iVar2);
          if (iVar17 != iVar3) {
            __assert_fail("Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x7fc,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          if (iVar2 < 1) {
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xec,"int Cba_ObjFonNum(Cba_Ntk_t *, int)");
          }
          iVar17 = (pCVar14->vOutputs).nSize;
          iVar3 = Cba_ObjFon0(p,iVar2 + 1);
          iVar5 = Cba_ObjFon0(p,iVar2);
          if (iVar17 != iVar3 - iVar5) {
            __assert_fail("Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x7fd,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          iVar17 = 0;
          while (iVar17 < (pCVar14->vInputs).nSize) {
            iVar3 = Vec_IntEntry(&pCVar14->vInputs,iVar17);
            iVar3 = Cba_ObjName(pCVar14,iVar3);
            iVar17 = iVar17 + 1;
            Cba_NtkSetMap2(p,iVar3,iVar17);
          }
        }
        else {
          lVar18 = (long)nInputs;
          if (lVar18 < 0) {
            __assert_fail("nInputs >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x803,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          lVar16 = 0;
          while (lVar18 != lVar16) {
            iVar17 = Cba_NtkStrId(p,ppcVar1[lVar16]);
            lVar16 = lVar16 + 1;
            Cba_NtkSetMap2(p,iVar17,(int)lVar16);
          }
        }
        for (iVar17 = 1; iVar17 < Prs_BoxSignals::V.nSize; iVar17 = iVar17 + 2) {
          iVar3 = Vec_IntEntry(&Prs_BoxSignals::V,iVar17 + -1);
          iVar5 = Vec_IntEntry(&Prs_BoxSignals::V,iVar17);
          iVar7 = Cba_NtkGetMap2(p,iVar3);
          if (iVar7 != 0) {
            iVar3 = Cba_NtkGetMap2(p,iVar3);
            iVar7 = Cba_ObjFinNum(p,iVar2);
            if (iVar7 < iVar3) {
              __assert_fail("Index < nBits",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x80d,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            iVar5 = Prs_CreateSignalIn(p,local_a8,iVar5);
            if (iVar5 != 0) {
              Cba_ObjSetFinFon(p,iVar2,iVar3 + -1,iVar5);
            }
          }
        }
        iVar17 = local_8c;
        if (((Cba_ObjType_t)local_80 & 0xfffffffe) == 0x28) {
          iVar17 = Cba_ObjFinFon(p,iVar2,1);
          local_a0 = (Vec_Int_t *)CONCAT44(local_a0._4_4_,iVar17);
          iVar17 = Cba_FonRangeSize(p,iVar17);
          iVar3 = Cba_ObjFinNum(p,iVar2);
          local_98 = (Vec_Int_t *)CONCAT44(extraout_var,iVar3);
          uVar4 = iVar3 - 1;
          iVar3 = iVar17 / (int)uVar4;
          iVar5 = Cba_ObjFinNum(p,iVar2);
          local_88 = (Vec_Ptr_t *)CONCAT44(local_88._4_4_,iVar5);
          iVar5 = Cba_ObjFinNum(p,iVar2);
          if (iVar5 < 2) {
            __assert_fail("Cba_ObjFinNum(p, iObj) >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x81a,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          if (iVar3 * uVar4 != iVar17) {
            __assert_fail("Slice * nParts == nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x81b,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          if ((uint)local_88 != (int)local_98) {
            __assert_fail("nFins == 1 + nParts",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x81c,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          local_88 = (Vec_Ptr_t *)(ulong)uVar4;
          if (iVar2 < 1) {
            pcVar11 = "i>0";
LAB_00359845:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0x102,"void Cba_ObjCleanFinFon(Cba_Ntk_t *, int, int)");
          }
          iVar5 = Cba_ObjFinFon(p,iVar2,1);
          if (iVar5 == 0) {
            pcVar11 = "Cba_ObjFinFon(p, i, k)!= 0";
            goto LAB_00359845;
          }
          iVar5 = Vec_IntEntry(local_40,iVar2);
          Vec_IntWriteEntry(local_38,iVar5 + 1,0);
          iVar5 = (uint)local_a0;
          if ((int)(uint)local_a0 < 0) {
            uVar4 = Cba_ObjAlloc(p,CBA_BOX_BUF,1,1);
            Cba_ObjSetFinFon(p,uVar4,0,iVar5);
            iVar5 = Cba_ObjFon0(p,uVar4);
            iVar7 = Cba_NtkNewStrId(p,"_buf_const_%d",(ulong)uVar4);
            Cba_FonSetName(p,iVar5,iVar7);
            iVar17 = Cba_NtkHashRange(p,iVar17 + -1,0);
            local_a0 = (Vec_Int_t *)CONCAT44(local_a0._4_4_,iVar5);
            Cba_FonSetRange(p,iVar5,iVar17);
          }
          iVar8 = 1;
          local_98 = (Vec_Int_t *)(ulong)(iVar3 - 1);
          iVar7 = 0;
          iVar5 = (int)local_88;
          if ((int)local_88 < 1) {
            iVar5 = 0;
          }
          for (; iVar17 = local_8c, iVar8 - iVar5 != 1; iVar8 = iVar8 + 1) {
            iVar17 = Cba_NtkHashRange(p,(int)local_98 + iVar7,iVar7);
            iVar17 = Prs_CreateSlice(p,(uint)local_a0,pNtk_00,iVar17);
            Cba_ObjSetFinFon(p,iVar2,iVar8,iVar17);
            iVar7 = iVar7 + iVar3;
          }
        }
        goto LAB_00359241;
      }
      IndexSet = -1;
      IndexRst = -1;
      iBitSet = -1;
      iBitRst = -1;
      iVar3 = Prs_CreateFlopSetReset
                        (p,pPVar19,&Prs_BoxSignals::V,&IndexSet,&IndexRst,&iBitSet,&iBitRst);
      if (iVar3 != 0) {
        Vec_IntWriteEntry(&Prs_BoxSignals::V,IndexSet,iBitSet);
        Vec_IntWriteEntry(&Prs_BoxSignals::V,IndexRst,iBitRst);
        goto LAB_00358ef8;
      }
      iVar3 = atoi(pcVar11 + (ulong)(CVar6 != CBA_BOX_DFFRS) * 2 + 0xb);
      local_98 = (Vec_Int_t *)CONCAT44(local_98._4_4_,iVar3);
      CVar6 = Cba_ObjType(p,iVar2);
      if (CVar6 != CBA_BOX_CONCAT) {
        __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_CONCAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x7cb,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      lVar18 = (long)nInputs;
      if (lVar18 < 0) {
        __assert_fail("nInputs >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x7cd,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      Cba_NtkCleanMap2(p);
      ppcVar1 = pOutNames;
      lVar16 = 0;
      while (lVar18 != lVar16) {
        iVar3 = Cba_NtkStrId(p,ppcVar1[lVar16]);
        lVar16 = lVar16 + 1;
        Cba_NtkSetMap2(p,iVar3,(int)lVar16);
      }
      uVar4 = 0;
      iVar3 = 0;
      if (0 < (int)local_98) {
        iVar3 = (int)local_98;
      }
      local_88 = (Vec_Ptr_t *)CONCAT44(local_88._4_4_,iVar3);
      while( true ) {
        pPVar19 = local_a8;
        if (uVar4 == (uint)local_88) break;
        iVar3 = Cba_ObjAlloc(p,(Cba_ObjType_t)local_80,4,1);
        pPVar19 = local_a8;
        iVar5 = Prs_BoxName(local_a8,iVar17);
        if (iVar5 != 0) {
          iVar17 = Prs_BoxName(pPVar19,iVar17);
          pcVar11 = Prs_NtkStr(pPVar19,iVar17);
          iVar17 = Cba_NtkNewStrId(p,"%s[%d]",pcVar11,(ulong)uVar4);
          Cba_ObjSetName(p,iVar3,iVar17);
        }
        local_a0 = (Vec_Int_t *)CONCAT44(local_a0._4_4_,uVar4);
        iVar17 = Cba_ObjFon0(p,iVar3);
        iVar5 = Cba_ObjFon0(p,iVar2);
        if ((p->vFonName).nSize < 1) {
          pcVar11 = "Cba_NtkHasFonNames(p)";
LAB_0035966b:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x11e,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
        }
        if (iVar5 < 1) {
          pcVar11 = "Cba_FonIsReal(f)";
          goto LAB_0035966b;
        }
        iVar5 = Cba_FonName(p,iVar5);
        pcVar11 = Cba_NtkStr(p,iVar5);
        uVar4 = (uint)local_a0;
        iVar5 = Cba_NtkNewStrId(p,"%s[%d]",pcVar11,(ulong)local_a0 & 0xffffffff);
        Cba_FonSetName(p,iVar17,iVar5);
        Cba_ObjSetFinFon(p,iVar2,~uVar4 + (int)local_98,iVar17);
        for (iVar17 = 1; iVar17 < Prs_BoxSignals::V.nSize; iVar17 = iVar17 + 2) {
          iVar5 = Vec_IntEntry(&Prs_BoxSignals::V,iVar17 + -1);
          iVar7 = Vec_IntEntry(&Prs_BoxSignals::V,iVar17);
          iVar8 = Cba_NtkGetMap2(p,iVar5);
          if (iVar8 != 0) {
            iVar5 = Cba_NtkGetMap2(p,iVar5);
            iVar7 = Prs_CreateSignalIn(p,local_a8,iVar7);
            if (iVar7 == 0) {
              __assert_fail("iFon",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x7eb,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            if (iVar5 < 4) {
              iVar7 = Prs_CreateSlice(p,iVar7,pNtk_01,0);
            }
            Cba_ObjSetFinFon(p,iVar3,iVar5 + -1,iVar7);
          }
        }
        uVar4 = (uint)local_a0 + 1;
        iVar17 = local_8c;
      }
    }
    else {
      iVar3 = Prs_BoxNtk(pPVar19,iVar17);
      local_80 = (Vec_Ptr_t *)CONCAT44(local_80._4_4_,iVar3);
      iVar3 = 0;
      for (iVar5 = 3; iVar5 < Prs_BoxSignals::V.nSize; iVar5 = iVar5 + 2) {
        Vec_IntEntry(&Prs_BoxSignals::V,iVar5 + -1);
        iVar7 = Vec_IntEntry(&Prs_BoxSignals::V,iVar5);
        iVar7 = Prs_CreateSignalIn(p,local_a8,iVar7);
        if (iVar7 != 0) {
          Cba_ObjSetFinFon(p,iVar2,iVar3,iVar7);
        }
        iVar3 = iVar3 + 1;
      }
LAB_00359241:
      pPVar19 = local_a8;
      if ((Cba_ObjType_t)local_80 == 0x57) {
        iVar3 = Cba_ObjFinFon(p,iVar2,1);
        if (iVar3 == 0) {
          Cba_ObjSetFinFon(p,iVar2,1,-2);
        }
        iVar3 = Cba_ObjFinFon(p,iVar2,2);
        if (iVar3 == 0) {
          iVar3 = 2;
          goto LAB_003592b9;
        }
      }
      else if (((Cba_ObjType_t)local_80 == 0x2f) && (iVar3 = Cba_ObjFinFon(p,iVar2,0), iVar3 == 0))
      {
        iVar3 = 0;
LAB_003592b9:
        Cba_ObjSetFinFon(p,iVar2,iVar3,-2);
      }
    }
    iVar17 = iVar17 + 1;
  } while( true );
}

Assistant:

int Prs_CreateVerilogNtk( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    Vec_Int_t * vBox2Obj = Vec_IntStart( Prs_NtkBoxNum(pNtk) );
    Vec_Int_t * vBox;  Vec_Ptr_t * vAllRams, * vRam;
    int i, k, iObj, iTerm, iFon, FormId, ActId, RangeId, NameId, Type;
    // map inputs
    Cba_NtkCleanMap( p );
    Cba_NtkForEachPi( p, iObj, i )
        Cba_NtkSetMap( p, Cba_ObjName(p, iObj), Cba_ObjFon0(p, iObj) );

    // map wire names into their rangeID
    Vec_IntForEachEntryTwo( &pNtk->vWires, &pNtk->vWiresR, NameId, RangeId, i )
        Cba_NtkSetMap( p, NameId, -RangeId );
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
        Cba_NtkSetMap( p, NameId, -RangeId );

    // collect RAMs and create boxes
    vAllRams = Prs_CreateDetectRams( pNtk );
    if ( vAllRams )
    Vec_PtrForEachEntry( Vec_Ptr_t *, vAllRams, vRam, i )
    {
        char * pRamName = (char *)Vec_PtrEntry( vRam, 0 );
        int MemSize = Abc_Ptr2Int( (char *)Vec_PtrEntry( vRam, 1 ) );
        //char Buffer[1000]; sprintf( Buffer, "%s_box", pRamName );
        //NameId = Cba_NtkNewStrId( p, Buffer ); 
        NameId = Cba_NtkNewStrId( p, "%s_box", pRamName );
        // create RAM object
        iObj = Cba_ObjAlloc( p, CBA_BOX_RAMBOX, Vec_PtrSize(vRam)-2, 1 );
        Cba_ObjSetName( p, iObj, NameId );
        iFon = Cba_ObjFon0(p, iObj);
        NameId = Cba_NtkNewStrId( p, pRamName ); 
        Cba_FonSetName( p, iFon, NameId );
        Prs_CreateRange( p, iFon, NameId );
        assert( Cba_FonLeft(p, iFon) <= MemSize-1 );
        assert( Cba_FonRight(p, iFon) == 0 );
        //Cba_VerificSaveLineFile( p, iObj, pNet->Linefile() );
        // create write ports feeding into this object
        Vec_PtrForEachEntryStart( Vec_Int_t *, vRam, vBox, k, 2 )
        {
            int iObjNew = Cba_ObjAlloc( p, CBA_BOX_RAMWC, 4, 1 );
            int Line = Vec_IntPop( vBox );
            Vec_IntWriteEntry( vBox2Obj, Line, iObjNew );
            if ( Prs_BoxName(pNtk, Line) )
                Cba_ObjSetName( p, iObjNew, Prs_BoxName(pNtk, Line) );
            //Cba_VerificSaveLineFile( p, iObjNew, pInst->Linefile() );
            // connect output
            iFon = Cba_ObjFon0(p, iObjNew);
            Cba_FonSetRange( p, iFon, Cba_NtkHashRange(p, MemSize-1, 0) );
            //sprintf( Buffer, "%s_wp%d", pRamName, k-2 );
            //NameId = Cba_NtkNewStrId( p, Buffer ); 
            NameId = Cba_NtkNewStrId( p, "%s_wp%d", pRamName, k-2 );
            Cba_FonSetName( p, iFon, NameId );
            Cba_NtkSetMap( p, NameId, iFon );
            // connet to RAM object
            Cba_ObjSetFinFon( p, iObj, (k++)-2, iFon );
            Vec_IntFree( vBox );
        }
        Vec_PtrFree( vRam );
    }
    Vec_PtrFreeP( &vAllRams );

    // create objects
    Vec_IntClear( &p->vArray0 );
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            Type = Prs_BoxNtk(pNtk, i);
            iObj = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, Prs_BoxIONum(pNtk, i)-1, Type == CBA_BOX_ADD ? 2 : 1 );
            Prs_CreateSignalOut( p, Cba_ObjFon0(p, iObj), pNtk, Vec_IntEntry(vBox, 1) ); // node output
        }
        else // box
        {
            Cba_Ntk_t * pBox = NULL; int nInputs, nOutputs = 1;
            char ** pOutNames = NULL, * pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
            Type = Prs_ManFindType( pNtkName, &nInputs, 1, &pOutNames );
            if ( Type == CBA_BOX_RAMWC )
                continue;
            if ( Type == CBA_OBJ_BOX )
            {
                pBox = Cba_ManNtkFind( p->pDesign, pNtkName );
                if ( pBox == NULL )
                {
                    printf( "Fatal error: Cannot find module \"%s\".\n", pNtkName );
                    continue;
                }
                nInputs = Cba_NtkPiNum(pBox);
                nOutputs = Cba_NtkPoNum(pBox);
            }
            else if ( Type == CBA_BOX_ADD || Type == CBA_BOX_DFFCPL )
                nOutputs = 2;
            else if ( Type == CBA_BOX_NMUX )
            {
                if ( !strncmp(pNtkName, "wide_mux_", strlen("wide_mux_")) )
                    nInputs = 1 + (1 << atoi(pNtkName+strlen("wide_mux_")));
                else if ( !strncmp(pNtkName, "Mux_", strlen("Mux_")) )
                    nInputs = 1 + (1 << atoi(pNtkName+strlen("Mux_")));
                else assert( 0 );
            }
            else if ( Type == CBA_BOX_SEL )
            {
                if ( !strncmp(pNtkName, "wide_select_", strlen("wide_select_")) )
                    nInputs = 1 + atoi(pNtkName+strlen("wide_select_"));
                else if ( !strncmp(pNtkName, "Select_", strlen("Select_")) )
                    nInputs = 1 + atoi(pNtkName+strlen("Select_"));
                else assert( 0 );
            }
            else if ( (Type == CBA_BOX_DFFRS || Type == CBA_BOX_LATCHRS) && !strncmp(pNtkName, "wide_", strlen("wide_")) && !Prs_CreateFlopSetReset(p, pNtk, vBox, NULL, NULL, NULL, NULL) )
                nInputs = atoi(pNtkName+strlen(Type == CBA_BOX_DFFRS ? "wide_dffrs_" : "wide_latchrs_")), nOutputs = 1, Type = CBA_BOX_CONCAT;
            // create object
            iObj = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, nInputs, nOutputs );
            if ( pBox ) Cba_ObjSetFunc( p, iObj, Cba_NtkId(pBox) );
            // mark PO objects
            Cba_NtkCleanMap2( p );
            if ( pBox )
                Cba_NtkForEachPo( pBox, iTerm, k )
                    Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            else
                for ( k = 0; k < nOutputs; k++ )
                    Cba_NtkSetMap2( p, Cba_NtkStrId(p, pOutNames[k]), k+1 );
            // map box fons
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Cba_ObjFon(p, iObj, Cba_NtkGetMap2(p, FormId)-1);
                    Prs_CreateSignalOut( p, iFon, pNtk, ActId );
                }
        }
        Vec_IntWriteEntry( vBox2Obj, i, iObj );
        if ( Prs_BoxName(pNtk, i) )
            Cba_ObjSetName( p, iObj, Prs_BoxName(pNtk, i) );
        //Cba_VerificSaveLineFile( p, iObj, pInst->Linefile() );
    }

    // create concatenations for split signals
    if ( Vec_IntSize(&p->vArray0) )
    {
        int Prev = -1, Index = 0;
        Vec_IntSortMulti( &p->vArray0, 3, 0 );
        Vec_IntForEachEntryTriple( &p->vArray0, NameId, RangeId, iFon, i )
        {
            if ( Prev != -1 && Prev != NameId )
                Prs_CreateOutConcat( p, Vec_IntArray(&p->vArray0) + Index, (i - Index)/3 ), Index = i;
            Prev = NameId;         
        }
        Prs_CreateOutConcat( p, Vec_IntArray(&p->vArray0) + Index, (i - Index)/3 ), Index = i;
        //Cba_VerificSaveLineFile( p, iObj, pInst->Linefile() );
    }

    // connect objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        iObj = Vec_IntEntry( vBox2Obj, i );
        if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            Type = Prs_BoxNtk(pNtk, i);
            Vec_IntForEachEntryDoubleStart( vBox, FormId, ActId, k, 2 )
            {
                iFon = Prs_CreateSignalIn( p, pNtk, ActId );
                if ( iFon )
                    Cba_ObjSetFinFon( p, iObj, k/2-1, iFon ); 
            }
        }
        else // box
        {
            int nInputs = -1;
            char ** pInNames = NULL, * pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
            Type = Prs_ManFindType( pNtkName, &nInputs, 0, &pInNames );
            if ( (Type == CBA_BOX_DFFRS || Type == CBA_BOX_LATCHRS) && !strncmp(pNtkName, "wide_", strlen("wide_")) )
            {
                int IndexSet = -1, IndexRst = -1,  iBitSet = -1, iBitRst = -1;
                int Status = Prs_CreateFlopSetReset( p, pNtk, vBox, &IndexSet, &IndexRst, &iBitSet, &iBitRst );
                if ( Status )
                {
                    Vec_IntWriteEntry( vBox, IndexSet, iBitSet );
                    Vec_IntWriteEntry( vBox, IndexRst, iBitRst );
                    // updated box should be fine
                }
                else
                {
                    int w, Width = atoi( pNtkName + strlen(Type == CBA_BOX_DFFRS ? "wide_dffrs_" : "wide_latchrs_") );
                    assert( Cba_ObjType(p, iObj) == CBA_BOX_CONCAT );
                    // prepare inputs
                    assert( nInputs >= 0 );
                    Cba_NtkCleanMap2( p );
                    for ( k = 0; k < nInputs; k++ )
                        Cba_NtkSetMap2( p, Cba_NtkStrId(p, pInNames[k]), k+1 );
                    // create bit-level objects
                    for ( w = 0; w < Width; w++ )
                    {
                        // create bit-level flop
                        int iObjNew = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, 4, 1 );
                        if ( Prs_BoxName(pNtk, i) )
                        {
                            NameId = Cba_NtkNewStrId( p, "%s[%d]", Prs_NtkStr(pNtk, Prs_BoxName(pNtk, i)), w );
                            Cba_ObjSetName( p, iObjNew, NameId );
                        }
                        //Cba_VerificSaveLineFile( p, iObjNew, pInst->Linefile() );
                        // set output fon
                        iFon = Cba_ObjFon0(p, iObjNew);
                        {
                            NameId = Cba_NtkNewStrId( p, "%s[%d]", Cba_FonNameStr(p, Cba_ObjFon0(p, iObj)), w );
                            Cba_FonSetName( p, iFon, NameId );
                        }
                        // no need to map this name because it may be produced elsewhere
                        //Cba_NtkSetMap( p, NameId, iFon );
                        // add the flop
                        Cba_ObjSetFinFon( p, iObj, Width-1-w, iFon );
                        // create bit-level flops
                        Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                            if ( Cba_NtkGetMap2(p, FormId) )
                            {
                                int Index = Cba_NtkGetMap2(p, FormId)-1;
                                iFon = Prs_CreateSignalIn( p, pNtk, ActId );  assert( iFon );
                                // create bit-select node for data/set/reset (but not for clock)
                                if ( Index < 3 ) // not clock
                                    iFon = Prs_CreateSlice( p, iFon, pNtk, 0 );
                                Cba_ObjSetFinFon( p, iObjNew, Index, iFon );
                            }
                    }
                    continue;
                }
            }
            assert( Type == Cba_ObjType(p, iObj) );
            //assert( nInputs == -1 || nInputs == Cba_ObjFinNum(p, iObj) );
            // mark PI objects
            Cba_NtkCleanMap2( p );
            if ( Type == CBA_OBJ_BOX )
            {
                Cba_Ntk_t * pBox = Cba_ObjNtk(p, iObj);
                assert( Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj) );
                assert( Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj) );
                Cba_NtkForEachPi( pBox, iTerm, k )
                    Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            }
            else
            {
                assert( nInputs >= 0 );
                for ( k = 0; k < nInputs; k++ )
                    Cba_NtkSetMap2( p, Cba_NtkStrId(p, pInNames[k]), k+1 );
            }
            // connect box fins
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    int Index = Cba_NtkGetMap2(p, FormId)-1;
                    int nBits = Cba_ObjFinNum(p, iObj);
                    assert( Index < nBits );
                    iFon = Prs_CreateSignalIn( p, pNtk, ActId );
                    if ( iFon )
                        Cba_ObjSetFinFon( p, iObj, Index, iFon );
                }
            // special cases
            if ( Type == CBA_BOX_NMUX || Type == CBA_BOX_SEL )
            {
                int FonCat = Cba_ObjFinFon( p, iObj, 1 );
                int nBits  = Cba_FonRangeSize( p, FonCat );
                int nParts = Cba_ObjFinNum(p, iObj) - 1;
                int Slice  = nBits / nParts;
                int nFins = Cba_ObjFinNum(p, iObj);
                assert( Cba_ObjFinNum(p, iObj) >= 2 );
                assert( Slice * nParts == nBits );
                assert( nFins == 1 + nParts );
                Cba_ObjCleanFinFon( p, iObj, 1 );
                // create buffer for the constant
                if ( FonCat < 0 ) 
                {
                    int iObjNew = Cba_ObjAlloc( p, CBA_BOX_BUF, 1, 1 );
                    Cba_ObjSetFinFon( p, iObjNew, 0, FonCat );
                    FonCat = Cba_ObjFon0( p, iObjNew );
                    NameId = Cba_NtkNewStrId( p, "_buf_const_%d", iObjNew );
                    Cba_FonSetName( p, FonCat, NameId );
                    Cba_FonSetRange( p, FonCat, Cba_NtkHashRange(p, nBits-1, 0) );
                }
                for ( k = 0; k < nParts; k++ )
                {
//                    iFon = Prs_CreateSlice( p, FonCat, pNtk, Cba_NtkHashRange(p, (nParts-1-k)*Slice+Slice-1, (nParts-1-k)*Slice) );
                    iFon = Prs_CreateSlice( p, FonCat, pNtk, Cba_NtkHashRange(p, k*Slice+Slice-1, k*Slice) );
                    Cba_ObjSetFinFon( p, iObj, k+1, iFon );
                }
            }
        }
        // if carry-in is not supplied, use constant 0
        if ( Type == CBA_BOX_ADD && Cba_ObjFinFon(p, iObj, 0) == 0 )
            Cba_ObjSetFinFon( p, iObj, 0, Cba_FonFromConst(1) );
        // if set or reset are not supplied, use constant 0
        if ( Type == CBA_BOX_DFFRS && Cba_ObjFinFon(p, iObj, 1) == 0 )
            Cba_ObjSetFinFon( p, iObj, 1, Cba_FonFromConst(1) );
        if ( Type == CBA_BOX_DFFRS && Cba_ObjFinFon(p, iObj, 2) == 0 )
            Cba_ObjSetFinFon( p, iObj, 2, Cba_FonFromConst(1) );
    }
    Vec_IntFree( vBox2Obj );
    // connect outputs
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
    {
        iObj = Cba_NtkPo( p, i );
        assert( NameId == Cba_ObjName(p, iObj) ); // direct name
        iFon = Prs_CreateVerilogFindFon( p, NameId );
        if ( !iFon ) 
            continue;
        Cba_ObjSetFinFon( p, iObj, 0, iFon );
        if ( RangeId )
        {
            assert( Cba_NtkRangeLeft(p, Abc_Lit2Var(RangeId))  == Cba_FonLeft(p, iFon) );
            assert( Cba_NtkRangeRight(p, Abc_Lit2Var(RangeId)) == Cba_FonRight(p, iFon) );
        }
    }
    return 0;
}